

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v2.cpp
# Opt level: O2

void __thiscall intel_keym_v2_t::signature_t::~signature_t(signature_t *this)

{
  ~signature_t(this);
  operator_delete(this);
  return;
}

Assistant:

intel_keym_v2_t::signature_t::~signature_t() {
    _clean_up();
}